

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode singleipconnect(Curl_easy *data,connectdata *conn,Curl_addrinfo *ai,int tempindex)

{
  undefined1 *puVar1;
  long lVar2;
  _Bool _Var3;
  uchar uVar4;
  if2ip_result_t iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  size_t sVar11;
  uint *puVar12;
  char *pcVar13;
  byte *pbVar14;
  uint uVar15;
  long lVar16;
  ushort uVar17;
  undefined4 uVar18;
  socklen_t __len;
  curltime cVar19;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  int optval;
  int port;
  int on;
  curl_socklen_t size;
  curl_socklen_t onoff;
  char ipaddress [46];
  char buffer [256];
  Curl_sockaddr_ex addr;
  Curl_sockaddr_storage add;
  char *local_350;
  uint local_348;
  uint local_344;
  byte *local_340;
  long local_338;
  uint local_32c;
  connectdata *local_328;
  int local_31c;
  Curl_dns_entry *local_318;
  undefined4 local_30c;
  undefined4 local_308;
  uint local_304 [2];
  socklen_t local_2fc;
  sockaddr local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char local_278 [48];
  int local_248 [64];
  undefined1 local_148 [144];
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_308 = 1;
  lVar16 = (long)tempindex;
  conn->tempsock[lVar16] = -1;
  iVar5 = Curl_socket(data,ai,(Curl_sockaddr_ex *)local_148,(curl_socket_t *)&local_348);
  if (iVar5 != IF2IP_NOT_FOUND) {
    return iVar5;
  }
  _Var3 = Curl_addr2string((sockaddr *)(local_148 + 0x10),local_148._12_4_,local_278,
                           (int *)local_304);
  if (!_Var3) {
    puVar12 = (uint *)__errno_location();
    uVar15 = *puVar12;
    pcVar13 = Curl_strerror(uVar15,(char *)local_248,0x100);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar15,pcVar13);
    Curl_closesocket(data,conn,local_348);
    return IF2IP_NOT_FOUND;
  }
  pcVar13 = "  Trying %s:%d...";
  if (local_148._0_4_ == 10) {
    pcVar13 = "  Trying [%s]:%d...";
  }
  Curl_infof(data,pcVar13,local_278,(ulong)local_304[0]);
  if (((local_148._0_4_ & 0xfffffff7) == 2) && (local_148._4_4_ == 1)) {
    uVar10 = *(ulong *)&(data->set).field_0x8e2;
    if ((uVar10 >> 0x20 & 1) != 0) {
      local_2f8._0_4_ = 1;
      iVar6 = setsockopt(local_348,6,1,&local_2f8,4);
      if (iVar6 < 0) {
        piVar9 = __errno_location();
        pcVar13 = Curl_strerror(*piVar9,(char *)local_248,0x100);
        Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar13);
      }
      uVar10 = *(ulong *)&(data->set).field_0x8e2;
    }
    uVar15 = local_348;
    if ((uVar10 >> 0x26 & 1) != 0) {
      local_248[0] = 1;
      iVar6 = setsockopt(local_348,1,9,local_248,4);
      if (iVar6 < 0) {
        pcVar13 = "Failed to set SO_KEEPALIVE on fd %d";
      }
      else {
        local_248[0] = curlx_sltosi((long)(data->set).tcp_keepidle);
        iVar6 = setsockopt(uVar15,6,4,local_248,4);
        if (iVar6 < 0) {
          Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d",(ulong)uVar15);
        }
        local_248[0] = curlx_sltosi((long)(data->set).tcp_keepintvl);
        iVar6 = setsockopt(uVar15,6,5,local_248,4);
        if (-1 < iVar6) goto LAB_00500464;
        pcVar13 = "Failed to set TCP_KEEPINTVL on fd %d";
      }
      Curl_infof(data,pcVar13,(ulong)uVar15);
    }
  }
LAB_00500464:
  uVar15 = local_348;
  if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_005004b6:
    uVar18 = 0;
  }
  else {
    Curl_set_in_callback(data,true);
    uVar15 = local_348;
    iVar6 = (*(data->set).fsockopt)((data->set).sockopt_client,local_348,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data,false);
    if (iVar6 == 0) goto LAB_005004b6;
    if (iVar6 != 2) {
      Curl_closesocket(data,conn,uVar15);
      return 0x2a;
    }
    uVar18 = 1;
  }
  if ((local_148._0_4_ & 0xfffffff7) != 2) goto LAB_00500ab6;
  local_344 = uVar15;
  uVar7 = Curl_ipv6_scope((sockaddr *)(local_148 + 0x10));
  local_328 = data->conn;
  local_318 = (Curl_dns_entry *)0x0;
  uVar17 = (data->set).localport;
  iVar6 = (data->set).localportrange;
  pbVar14 = (byte *)(data->set).str[8];
  local_304[1] = 1;
  local_338 = CONCAT44(local_338._4_4_,(uint)uVar17);
  uVar15 = local_344;
  if (uVar17 == 0 && pbVar14 == (byte *)0x0) goto LAB_00500ab6;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8.sa_family = 0;
  local_2f8.sa_data[0] = '\0';
  local_2f8.sa_data[1] = '\0';
  local_2f8.sa_data[2] = '\0';
  local_2f8.sa_data[3] = '\0';
  local_2f8.sa_data[4] = '\0';
  local_2f8.sa_data[5] = '\0';
  local_2f8.sa_data[6] = '\0';
  local_2f8.sa_data[7] = '\0';
  local_2f8.sa_data[8] = '\0';
  local_2f8.sa_data[9] = '\0';
  local_2f8.sa_data[10] = '\0';
  local_2f8.sa_data[0xb] = '\0';
  local_2f8.sa_data[0xc] = '\0';
  local_2f8.sa_data[0xd] = '\0';
  local_32c = uVar7;
  local_30c = uVar18;
  if ((pbVar14 == (byte *)0x0) ||
     (local_340 = pbVar14, sVar11 = strlen((char *)pbVar14), 0xfe < sVar11)) {
    uVar17 = (ushort)local_338;
    uVar15 = (uint)local_338;
    if (local_148._0_4_ == 2) {
      local_2f8.sa_data._0_2_ = uVar17 << 8 | uVar17 >> 8;
      local_2f8.sa_family = 2;
      __len = 0x10;
    }
    else {
      __len = 0;
      if (local_148._0_4_ == 10) {
        local_2f8.sa_data._0_2_ = uVar17 << 8 | uVar17 >> 8;
        local_2f8.sa_family = 10;
        __len = 0x1c;
      }
    }
LAB_0050090a:
    uVar7 = local_344;
    local_338 = lVar16;
    setsockopt(local_344,0,0x18,local_304 + 1,4);
    iVar8 = bind(uVar7,&local_2f8,__len);
    if (iVar8 < 0) {
      uVar7 = uVar15 & 0xffff;
      do {
        uVar7 = uVar7 + 1;
        if ((iVar6 < 2) || (uVar17 = (ushort)uVar7, uVar17 == 0)) {
          puVar12 = (uint *)__errno_location();
          uVar15 = *puVar12;
          (data->state).os_errno = uVar15;
          pcVar13 = Curl_strerror(uVar15,(char *)local_248,0x100);
          Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar15,pcVar13);
          Curl_closesocket(data,conn,local_348);
          return 0x2d;
        }
        Curl_infof(data,"Bind to local port %hu failed, trying next",(ulong)((uVar7 & 0xffff) - 1));
        local_2f8.sa_data._0_2_ = uVar17 << 8 | uVar17 >> 8;
        iVar8 = bind(local_344,&local_2f8,__len);
        uVar15 = uVar15 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar8 < 0);
    }
    local_2fc = 0x80;
    local_b8.sa_family = 0;
    local_b8.sa_data[0] = '\0';
    local_b8.sa_data[1] = '\0';
    local_b8.sa_data[2] = '\0';
    local_b8.sa_data[3] = '\0';
    local_b8.sa_data[4] = '\0';
    local_b8.sa_data[5] = '\0';
    local_b8.sa_data[6] = '\0';
    local_b8.sa_data[7] = '\0';
    local_b8.sa_data[8] = '\0';
    local_b8.sa_data[9] = '\0';
    local_b8.sa_data[10] = '\0';
    local_b8.sa_data[0xb] = '\0';
    local_b8.sa_data[0xc] = '\0';
    local_b8.sa_data[0xd] = '\0';
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    iVar6 = getsockname(local_344,&local_b8,&local_2fc);
    if (iVar6 < 0) {
      puVar12 = (uint *)__errno_location();
      uVar15 = *puVar12;
      (data->state).os_errno = uVar15;
      pcVar13 = Curl_strerror(uVar15,(char *)local_248,0x100);
      Curl_failf(data,"getsockname() failed with errno %d: %s",(ulong)uVar15,pcVar13);
      iVar5 = 0x2d;
      lVar16 = local_338;
    }
    else {
      iVar5 = IF2IP_NOT_FOUND;
      Curl_infof(data,"Local port: %hu",(ulong)(uVar15 & 0xffff));
      puVar1 = &(local_328->bits).field_0x6;
      *puVar1 = *puVar1 | 0x80;
      lVar16 = local_338;
    }
  }
  else {
    memset(local_248,0,0x100);
    local_31c = *local_340 - 0x69;
    if ((local_31c == 0) && (local_31c = local_340[1] - 0x66, local_31c == 0)) {
      local_31c = 0x21 - (uint)local_340[2];
    }
    else {
      local_31c = -local_31c;
    }
    if (local_31c != 0) {
      iVar8 = strncmp("host!",(char *)local_340,5);
      pbVar14 = local_340;
      if (iVar8 != 0) goto LAB_00500662;
      local_340 = local_340 + 5;
      goto LAB_00500744;
    }
    pbVar14 = local_340 + 3;
LAB_00500662:
    sVar11 = strlen((char *)pbVar14);
    iVar8 = setsockopt(local_344,1,0x19,pbVar14,(int)sVar11 + 1);
    if (iVar8 == 0) {
      iVar5 = IF2IP_NOT_FOUND;
      goto LAB_00500a89;
    }
    local_340 = pbVar14;
    iVar5 = Curl_if2ip(local_148._0_4_,local_32c,local_328->scope_id,(char *)pbVar14,
                       (char *)local_248,0x100);
    if (iVar5 == IF2IP_FOUND) {
      Curl_infof(data,"Local Interface %s is ip %s using address family %i",local_340,local_248,
                 local_148._0_4_);
LAB_00500813:
      lVar2 = local_338;
      __len = 0;
      if (local_148._0_4_ == 2) {
        iVar8 = inet_pton(2,(char *)local_248,local_2f8.sa_data + 2);
        uVar15 = (uint)local_338;
        if (0 < iVar8) {
          local_2f8.sa_data._0_2_ = (ushort)local_338 << 8 | (ushort)local_338 >> 8;
          local_2f8.sa_family = 2;
          __len = 0x10;
        }
      }
      else {
        uVar15 = (uint)local_338;
        if (local_148._0_4_ == 10) {
          pcVar13 = strchr((char *)local_248,0x25);
          if (pcVar13 == (char *)0x0) {
            local_350 = (char *)0x0;
          }
          else {
            local_350 = pcVar13 + 1;
            *pcVar13 = '\0';
          }
          iVar8 = inet_pton(10,(char *)local_248,local_2f8.sa_data + 6);
          __len = 0x1c;
          if (0 < iVar8) {
            local_2f8.sa_data._0_2_ = (ushort)lVar2 << 8 | (ushort)lVar2 >> 8;
            local_2f8.sa_family = 10;
            if (local_350 != (char *)0x0) {
              iVar8 = atoi(local_350);
              uStack_2e0 = CONCAT44(uStack_2e0._4_4_,iVar8);
            }
          }
        }
      }
      goto LAB_0050090a;
    }
    if (iVar5 == IF2IP_AF_NOT_SUPPORTED) goto LAB_00500a89;
    if (iVar5 == IF2IP_NOT_FOUND) {
      if (local_31c != 0) {
LAB_00500744:
        local_32c = CONCAT31(local_32c._1_3_,local_328->ip_version);
        if (local_148._0_4_ == 2) {
          uVar4 = '\x01';
LAB_00500763:
          local_328->ip_version = uVar4;
        }
        else if (local_148._0_4_ == 10) {
          uVar4 = '\x02';
          goto LAB_00500763;
        }
        Curl_resolv(data,(char *)local_340,0,false,&local_318);
        local_328->ip_version = (uchar)local_32c;
        if (local_318 != (Curl_dns_entry *)0x0) {
          Curl_printable_address(local_318->addr,(char *)local_248,0x100);
          Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",local_340,
                     (ulong)(uint)local_148._0_4_,local_248,(ulong)(uint)local_318->addr->ai_family)
          ;
          Curl_resolv_unlock(data,local_318);
          iVar5 = IF2IP_AF_NOT_SUPPORTED;
          if (local_318->addr->ai_family != local_148._0_4_) goto LAB_00500a89;
          goto LAB_00500813;
        }
        goto LAB_00500855;
      }
      pcVar13 = "Couldn\'t bind to interface \'%s\'";
    }
    else {
      if (local_31c != 0) goto LAB_00500744;
LAB_00500855:
      puVar1 = &(data->state).field_0x6d0;
      *puVar1 = *puVar1 & 0xf7;
      pcVar13 = "Couldn\'t bind to \'%s\'";
    }
    Curl_failf(data,pcVar13,local_340);
    iVar5 = 0x2d;
  }
LAB_00500a89:
  uVar15 = local_348;
  uVar18 = local_30c;
  if (iVar5 != IF2IP_NOT_FOUND) {
    Curl_closesocket(data,conn,local_348);
    if (iVar5 == IF2IP_AF_NOT_SUPPORTED) {
      return 7;
    }
    return iVar5;
  }
LAB_00500ab6:
  curlx_nonblock(uVar15,1);
  cVar19 = Curl_now();
  (conn->connecttime).tv_sec = cVar19.tv_sec;
  (conn->connecttime).tv_usec = cVar19.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(data,conn->timeoutms_per_addr[0],EXPIRE_DNS_PER_NAME);
    Curl_expire(data,conn->timeoutms_per_addr[1],EXPIRE_DNS_PER_NAME2);
  }
  if (((char)uVar18 == '\0') && (conn->transport != '\x04')) {
    if ((((conn->bits).field_0x7 & 2) != 0) &&
       (iVar6 = setsockopt(uVar15,6,0x1e,&local_308,4), iVar6 < 0)) {
      Curl_infof(data,"Failed to enable TCP Fast Open on fd %d",(ulong)uVar15);
    }
    iVar6 = connect(uVar15,(sockaddr *)(local_148 + 0x10),local_148._12_4_);
    if (iVar6 == -1) {
      piVar9 = __errno_location();
      iVar6 = *piVar9;
      if ((iVar6 != 0xb) && (iVar6 != 0x73)) {
        pcVar13 = Curl_strerror(iVar6,(char *)local_248,0x100);
        Curl_infof(data,"Immediate connect fail for %s: %s",local_278,pcVar13);
        (data->state).os_errno = iVar6;
        Curl_closesocket(data,conn,uVar15);
        return 7;
      }
    }
  }
  conn->tempsock[lVar16] = uVar15;
  return IF2IP_NOT_FOUND;
}

Assistant:

static CURLcode singleipconnect(struct Curl_easy *data,
                                struct connectdata *conn,
                                const struct Curl_addrinfo *ai,
                                int tempindex)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  int port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif
  const char *ipmsg;
  char buffer[STRERROR_LEN];
  curl_socket_t *sockp = &conn->tempsock[tempindex];
  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(data, ai, &addr, &sockfd);
  if(result)
    return result;

  /* store remote address and port used in this connection attempt */
  if(!Curl_addr2string((struct sockaddr*)&addr.sa_addr, addr.addrlen,
                       ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, sockfd);
    return CURLE_OK;
  }
#ifdef ENABLE_IPV6
  if(addr.family == AF_INET6)
    ipmsg = "  Trying [%s]:%d...";
  else
#endif
    ipmsg = "  Trying %s:%d...";
  infof(data, ipmsg, ipaddress, port);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, sockfd);

  nosigpipe(data, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(data, conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(data, conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1) {
    Curl_expire(data, conn->timeoutms_per_addr[0], EXPIRE_DNS_PER_NAME);
    Curl_expire(data, conn->timeoutms_per_addr[1], EXPIRE_DNS_PER_NAME2);
  }

  /* Connect TCP and QUIC sockets */
  if(!isconnected && (conn->transport != TRNSPRT_UDP)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d", sockfd);

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
#ifdef ENABLE_QUIC
    else if(conn->transport == TRNSPRT_QUIC) {
      /* pass in 'sockfd' separately since it hasn't been put into the
         tempsock array at this point */
      result = Curl_quic_connect(data, conn, sockfd, tempindex,
                                 &addr.sa_addr, addr.addrlen);
      if(result)
        error = SOCKERRNO;
    }
#endif
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(data, conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}